

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  ifstream *input_stream;
  initializer_list<double> __l;
  allocator local_4d5;
  int num_element;
  string local_4d0;
  EntropyUnits local_4ac;
  ulong local_4a8;
  int num_data;
  vector<double,_std::allocator<double>_> average_entropy;
  double entropy;
  vector<double,_std::allocator<double>_> probability;
  StatisticsAccumulation statistics_accumulation;
  ostringstream error_message_4;
  EntropyCalculation entropy_calculation;
  Buffer buffer;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_element = 0x100;
  local_4a8 = 0;
  local_4ac = kBit;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:o:fh",(option *)0x0,(int *)0x0);
    if (9 < iVar4 - 0x66U) {
      if (iVar4 != -1) {
switchD_00102618_caseD_67:
        anon_unknown.dwarf_2ef7::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string((string *)&error_message_4,"entropy",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001027ad;
      }
      if (argc == ya_optind) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&error_message_4,"entropy",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001027ad;
      }
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((pcVar6 != (char *)0x0) &&
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar6),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        poVar5 = std::operator<<((ostream *)&error_message_4,"Cannot open file ");
        std::operator<<(poVar5,pcVar6);
        std::__cxx11::string::string((string *)&buffer,"entropy",(allocator *)&local_4d0);
        sptk::PrintErrorMessage((string *)&buffer,&error_message_4);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
        iVar4 = 1;
        goto LAB_00102db1;
      }
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        input_stream = (ifstream *)&std::cin;
      }
      iVar4 = 1;
      sptk::StatisticsAccumulation::StatisticsAccumulation(&statistics_accumulation,0,1,false,false)
      ;
      sptk::StatisticsAccumulation::Buffer::Buffer(&buffer);
      sptk::EntropyCalculation::EntropyCalculation(&entropy_calculation,num_element,local_4ac);
      if ((statistics_accumulation.is_valid_ == true) && (entropy_calculation.is_valid_ != false)) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&probability,(long)num_element,(allocator_type *)&error_message_4);
        break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
      std::operator<<((ostream *)&error_message_4,"Failed to initialize EntropyCalculation");
      std::__cxx11::string::string((string *)&local_4d0,"entropy",(allocator *)&probability);
      sptk::PrintErrorMessage(&local_4d0,&error_message_4);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
      goto LAB_00102da4;
    }
    switch(iVar4) {
    case 0x66:
      local_4a8 = CONCAT71((int7)((ulong)((long)&switchD_00102618::switchdataD_0010b004 +
                                         (long)(int)(&switchD_00102618::switchdataD_0010b004)
                                                    [iVar4 - 0x66U]) >> 8),1);
      break;
    default:
      goto switchD_00102618_caseD_67;
    case 0x68:
      anon_unknown.dwarf_2ef7::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&num_element);
      bVar1 = num_element < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_4,"entropy",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
LAB_001027ad:
        std::__cxx11::string::~string((string *)&error_message_4);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
      bVar1 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&buffer);
      if (bVar1) {
        bVar1 = sptk::IsInRange((EntropyUnits)buffer._vptr_Buffer,0,2);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar1) {
          local_4ac = (EntropyUnits)buffer._vptr_Buffer;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ")
      ;
      poVar5 = std::operator<<(poVar5,"in the range of ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
      poVar5 = std::operator<<(poVar5," to ");
      std::ostream::operator<<((ostream *)poVar5,2);
      std::__cxx11::string::string((string *)&error_message_4,"entropy",(allocator *)&local_4d0);
      sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
      goto LAB_001027ad;
    }
  } while( true );
LAB_001029af:
  bVar1 = sptk::ReadStream<double>
                    (false,0,0,num_element,&probability,(istream *)input_stream,(int *)0x0);
  if (!bVar1) {
    bVar1 = sptk::StatisticsAccumulation::GetNumData(&statistics_accumulation,&buffer,&num_data);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
      std::operator<<((ostream *)&error_message_4,"Failed to accumulate statistics");
      std::__cxx11::string::string((string *)&local_4d0,"entropy",(allocator *)&average_entropy);
      sptk::PrintErrorMessage(&local_4d0,&error_message_4);
      goto LAB_00102d80;
    }
    if ((local_4a8 & 1) == 0 && 0 < num_data) {
      std::vector<double,_std::allocator<double>_>::vector
                (&average_entropy,1,(allocator_type *)&error_message_4);
      bVar1 = sptk::StatisticsAccumulation::GetMean
                        (&statistics_accumulation,&buffer,&average_entropy);
      if (bVar1) {
        bVar3 = sptk::WriteStream<double>(0,1,&average_entropy,(ostream *)&std::cout,(int *)0x0);
        bVar1 = true;
        iVar4 = 0;
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
          std::operator<<((ostream *)&error_message_4,"Failed to write entropy");
          std::__cxx11::string::string((string *)&local_4d0,"entropy",&local_4d5);
          sptk::PrintErrorMessage(&local_4d0,&error_message_4);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
          bVar1 = false;
          iVar4 = 1;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        std::operator<<((ostream *)&error_message_4,"Failed to calculate entropy");
        std::__cxx11::string::string((string *)&local_4d0,"entropy",&local_4d5);
        sptk::PrintErrorMessage(&local_4d0,&error_message_4);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
        iVar4 = 1;
        bVar1 = false;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&average_entropy.super__Vector_base<double,_std::allocator<double>_>);
      if (!bVar1) goto LAB_00102d9a;
    }
    iVar4 = 0;
    goto LAB_00102d9a;
  }
  bVar1 = sptk::EntropyCalculation::Run(&entropy_calculation,&probability,&entropy);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to calculate entropy");
    std::__cxx11::string::string((string *)&local_4d0,"entropy",(allocator *)&average_entropy);
    sptk::PrintErrorMessage(&local_4d0,&error_message_4);
    goto LAB_00102d80;
  }
  if ((local_4a8 & 1) != 0) {
    bVar1 = sptk::WriteStream<double>(entropy,(ostream *)&std::cout);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
      std::operator<<((ostream *)&error_message_4,"Failed to write entropy");
      std::__cxx11::string::string((string *)&local_4d0,"entropy",(allocator *)&average_entropy);
      sptk::PrintErrorMessage(&local_4d0,&error_message_4);
      goto LAB_00102d80;
    }
    goto LAB_001029af;
  }
  local_4d0._M_dataplus._M_p = (pointer)entropy;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_4d0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&error_message_4,__l,
             (allocator_type *)&average_entropy);
  bVar1 = sptk::StatisticsAccumulation::Run
                    (&statistics_accumulation,
                     (vector<double,_std::allocator<double>_> *)&error_message_4,&buffer);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&error_message_4);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to accumulate statistics");
    std::__cxx11::string::string((string *)&local_4d0,"entropy",(allocator *)&average_entropy);
    sptk::PrintErrorMessage(&local_4d0,&error_message_4);
LAB_00102d80:
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
    iVar4 = 1;
LAB_00102d9a:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&probability.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102da4:
    sptk::StatisticsAccumulation::Buffer::~Buffer(&buffer);
LAB_00102db1:
    std::ifstream::~ifstream(&ifs);
    return iVar4;
  }
  goto LAB_001029af;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_element(kDefaultNumElement);
  sptk::EntropyCalculation::EntropyUnits entropy_unit(kDefaultEntropyUnit);
  bool output_frame_by_frame(kDefaultOutputFrameByFrameFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:o:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_element) ||
            num_element <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(
                          sptk::EntropyCalculation::EntropyUnits::kNumUnits) -
                      1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("entropy", error_message);
          return 1;
        }
        entropy_unit = static_cast<sptk::EntropyCalculation::EntropyUnits>(tmp);
        break;
      }
      case 'f': {
        output_frame_by_frame = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation statistics_accumulation(0, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  sptk::EntropyCalculation entropy_calculation(num_element, entropy_unit);
  if (!statistics_accumulation.IsValid() || !entropy_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize EntropyCalculation";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  std::vector<double> probability(num_element);
  double entropy;

  while (sptk::ReadStream(false, 0, 0, num_element, &probability, &input_stream,
                          NULL)) {
    if (!entropy_calculation.Run(probability, &entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }

    if (output_frame_by_frame) {
      if (!sptk::WriteStream(entropy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write entropy";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    } else {
      if (!statistics_accumulation.Run(std::vector<double>{entropy}, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("entropy", error_message);
        return 1;
      }
    }
  }

  int num_data;
  if (!statistics_accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("entropy", error_message);
    return 1;
  }

  if (!output_frame_by_frame && 0 < num_data) {
    std::vector<double> average_entropy(1);
    if (!statistics_accumulation.GetMean(buffer, &average_entropy)) {
      std::ostringstream error_message;
      error_message << "Failed to calculate entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, 1, average_entropy, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write entropy";
      sptk::PrintErrorMessage("entropy", error_message);
      return 1;
    }
  }

  return 0;
}